

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall ExpressionContext::AddAlias(ExpressionContext *this,AliasData *alias)

{
  uint uVar1;
  ScopeData *pSVar2;
  TypeLookupResult local_38;
  TypeLookupResult local_28;
  AliasData *local_18;
  AliasData *alias_local;
  ExpressionContext *this_local;
  
  local_18 = alias;
  alias_local = (AliasData *)this;
  SmallArray<AliasData_*,_2U>::push_back(&this->scope->aliases,&local_18);
  if (this->scope->type == SCOPE_NAMESPACE) {
    pSVar2 = this->globalScope;
    uVar1 = local_18->nameHash;
    TypeLookupResult::TypeLookupResult(&local_28,local_18);
    DirectChainedMap<TypeLookupResult>::insert(&pSVar2->typeLookupMap,uVar1,local_28);
  }
  else {
    pSVar2 = this->scope;
    uVar1 = local_18->nameHash;
    TypeLookupResult::TypeLookupResult(&local_38,local_18);
    DirectChainedMap<TypeLookupResult>::insert(&pSVar2->typeLookupMap,uVar1,local_38);
  }
  return;
}

Assistant:

void ExpressionContext::AddAlias(AliasData *alias)
{
	scope->aliases.push_back(alias);

	// Namespaces are allowed only in global scope and namespaced alias names are globally accessible through namespace name
	if(scope->type == SCOPE_NAMESPACE)
		globalScope->typeLookupMap.insert(alias->nameHash, TypeLookupResult(alias));
	else
		scope->typeLookupMap.insert(alias->nameHash, TypeLookupResult(alias));
}